

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::anon_unknown_6::AssignDescriptorsImpl(DescriptorTable *table,bool eager)

{
  int iVar1;
  Nonnull<std::atomic<uint32_t>_*> control;
  char *__s;
  DescriptorPool *this;
  size_t sVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  long lVar5;
  string_view name;
  AssignDescriptorsHelper helper;
  AssignDescriptorsHelper local_58;
  
  if ((anonymous_namespace)::
      AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)::mu == '\0')
  goto LAB_001fb96c;
  while( true ) {
    absl::lts_20250127::Mutex::Lock(&AssignDescriptorsImpl::mu);
    internal::AddDescriptors(table);
    absl::lts_20250127::Mutex::Unlock(&AssignDescriptorsImpl::mu);
    if ((eager) && (iVar1 = table->num_deps, 0 < (long)iVar1)) {
      lVar4 = 0;
      do {
        lVar5 = *(long *)((long)table->deps + lVar4);
        if (lVar5 != 0) {
          control = *(Nonnull<std::atomic<uint32_t>_*> *)(lVar5 + 0x18);
          local_58.factory_ = (MessageFactory *)CONCAT71(local_58.factory_._1_7_,1);
          if ((control->super___atomic_base<unsigned_int>)._M_i != 0xdd) {
            absl::lts_20250127::base_internal::
            CallOnceImpl<void(&)(google::protobuf::internal::DescriptorTable_const*,bool),google::protobuf::internal::DescriptorTable_const*const&,bool>
                      (control,SCHEDULE_COOPERATIVE_AND_KERNEL,AssignDescriptorsImpl,
                       (DescriptorTable **)((long)table->deps + lVar4),(bool *)&local_58);
          }
        }
        lVar4 = lVar4 + 8;
      } while ((long)iVar1 * 8 != lVar4);
    }
    this = DescriptorPool::internal_generated_pool();
    __s = table->filename;
    sVar2 = strlen(__s);
    name._M_str = __s;
    name._M_len = sVar2;
    pFVar3 = DescriptorPool::FindFileByName(this,name);
    if (pFVar3 != (FileDescriptor *)0x0) break;
    _GLOBAL__N_1::AssignDescriptorsImpl((_GLOBAL__N_1 *)&local_58);
LAB_001fb96c:
    _GLOBAL__N_1::AssignDescriptorsImpl();
  }
  local_58.factory_ = MessageFactory::generated_factory();
  local_58.file_level_enum_descriptors_ = table->file_level_enum_descriptors;
  local_58.schemas_ = table->schemas;
  local_58.default_instance_data_ = table->default_instances;
  local_58.offsets_ = table->offsets;
  if (0 < pFVar3->message_type_count_) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      AssignDescriptorsHelper::AssignMessageDescriptor
                (&local_58,(Descriptor *)(&pFVar3->message_types_->super_SymbolBase + lVar4));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa0;
    } while (lVar5 < pFVar3->message_type_count_);
  }
  iVar1 = pFVar3->enum_type_count_;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      *local_58.file_level_enum_descriptors_ =
           (EnumDescriptor *)(&pFVar3->enum_types_->super_SymbolBase + lVar4);
      local_58.file_level_enum_descriptors_ = local_58.file_level_enum_descriptors_ + 1;
      lVar4 = lVar4 + 0x58;
    } while ((long)iVar1 * 0x58 - lVar4 != 0);
  }
  if (((pFVar3->options_->field_0)._impl_.cc_generic_services_ == true) &&
     (iVar1 = pFVar3->service_count_, 0 < (long)iVar1)) {
    lVar4 = 0;
    do {
      table->file_level_service_descriptors[lVar4] = pFVar3->services_ + lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  return;
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table, bool eager) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static absl::Mutex mu{absl::kConstInit};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  if (eager) {
    // Normally we do not want to eagerly build descriptors of our deps.
    // However if this proto is optimized for code size (ie using reflection)
    // and it has a message extending a custom option of a descriptor with that
    // message being optimized for code size as well. Building the descriptors
    // in this file requires parsing the serialized file descriptor, which now
    // requires parsing the message extension, which potentially requires
    // building the descriptor of the message extending one of the options.
    // However we are already updating descriptor pool under a lock. To prevent
    // this the compiler statically looks for this case and we just make sure we
    // first build the descriptors of all our dependencies, preventing the
    // deadlock.
    int num_deps = table->num_deps;
    for (int i = 0; i < num_deps; i++) {
      // In case of weak fields deps[i] could be null.
      if (table->deps[i]) {
        absl::call_once(*table->deps[i]->once, AssignDescriptorsImpl,
                        table->deps[i],
                        /*eager=*/true);
      }
    }
  }

  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  ABSL_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(factory, table->file_level_enum_descriptors,
                                 table->schemas, table->default_instances,
                                 table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
}